

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.hpp
# Opt level: O0

void Model::ddHduu(double *ret,double *x,double *u,double *p,double *lmd)

{
  double *lmd_local;
  double *p_local;
  double *u_local;
  double *x_local;
  double *ret_local;
  
  *ret = u[2] + u[2] + 1.0;
  ret[1] = 0.0;
  ret[2] = (*u - 0.5) * 2.0;
  ret[3] = 0.0;
  ret[4] = u[2] * 2.0;
  ret[5] = u[1] * 2.0;
  ret[6] = (*u - 0.5) * 2.0;
  ret[7] = u[1] * 2.0;
  ret[8] = 0.0;
  return;
}

Assistant:

static void ddHduu(double* ret, const double* x, const double* u, const double* p, const double* lmd) {
    ret[0] = r0 + 2 * u[2];
    ret[1] = 0;
    ret[2] = 2 * (u[0] - uc);

    ret[3] = 0;
    ret[4] = 2 * u[2];
    ret[5] = 2 * u[1];

    ret[6] = 2 * (u[0] - uc);
    ret[7] = 2 * u[1];
    ret[8] = 0;
  }